

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O2

uint8_t read_varuint7(uint8_t **cursor,uint8_t *end)

{
  uint8_t uVar1;
  undefined8 extraout_RAX;
  string sStack_28;
  
  uVar1 = read_byte(cursor,end);
  if (-1 < (char)uVar1) {
    return uVar1;
  }
  StringFormat_abi_cxx11_(&sStack_28,"malformed %d",0x12a);
  ThrowString(&sStack_28);
  std::__cxx11::string::~string((string *)&sStack_28);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

uint8_t read_varuint7 (uint8_t** cursor, const uint8_t* end)
{
    const uint8_t result = read_byte (cursor, end);
    if (result & 0x80)
        ThrowString (StringFormat ("malformed %d", __LINE__)); // UNDONE context (move to module or section)
    return result;
}